

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locale-test.cc
# Opt level: O2

void __thiscall LocaleTest_Format_Test::TestBody(LocaleTest_Format_Test *this)

{
  numpunct<char> *this_00;
  int *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual;
  char *pcVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_2
  in_R9;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  AssertionResult gtest_ar_2;
  AssertHelper local_58;
  string s;
  locale loc;
  format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_int>
  as;
  AssertHelper local_18;
  
  std::locale::locale((locale *)&s);
  this_00 = (numpunct<char> *)operator_new(0x18);
  *(undefined8 *)this_00 = 0;
  *(undefined8 *)&this_00->field_0x8 = 0;
  *(undefined8 *)&this_00->field_0x10 = 0;
  numpunct<char>::numpunct(this_00);
  std::locale::locale<numpunct<char>>(&loc,(locale *)&s,this_00);
  std::locale::~locale((locale *)&s);
  std::locale::locale((locale *)&gtest_ar_2);
  local_58.data_._0_4_ = 0x12d687;
  fmt::v5::format<char[5],int>(&s,(v5 *)&gtest_ar_2,(locale *)"{:n}",(char (*) [5])&local_58,in_R8);
  actual = &s;
  testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
            ((internal *)&as,"\"1,234,567\"","fmt::format(std::locale(), \"{:n}\", 1234567)",
             (char (*) [10])"1,234,567",actual);
  std::__cxx11::string::~string((string *)&s);
  std::locale::~locale((locale *)&gtest_ar_2);
  if (as.data_[0].field_0.int_value._0_1_ == '\0') {
    testing::Message::Message((Message *)&s);
    if (as.data_[0].field_0.string.size == 0) {
      actual = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1411ce;
    }
    else {
      actual = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                as.data_[0].field_0.custom.format;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/locale-test.cc"
               ,0x13,(char *)actual);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&s);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&s);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&as.data_[0].field_0.string.size);
  gtest_ar_2.success_ = true;
  gtest_ar_2._1_3_ = 0x12d6;
  fmt::v5::format<char[5],int>(&s,(v5 *)&loc,(locale *)"{:n}",&gtest_ar_2.success_,(int *)actual);
  testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
            ((internal *)&as,"\"1~234~567\"","fmt::format(loc, \"{:n}\", 1234567)",
             (char (*) [10])"1~234~567",&s);
  std::__cxx11::string::~string((string *)&s);
  if (as.data_[0].field_0.int_value._0_1_ == '\0') {
    testing::Message::Message((Message *)&s);
    if (as.data_[0].field_0.string.size == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)as.data_[0].field_0.custom.format;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/locale-test.cc"
               ,0x14,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&s);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&s);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&as.data_[0].field_0.string.size);
  as.data_[0].field_0.double_value = 6.0995714218929e-318;
  args.field_1.values_ = in_R9.values_;
  args.types_ = (unsigned_long_long)&as;
  fmt::v5::vformat<char[5],char>
            (&s,(v5 *)&loc,(locale *)"{:n}",
             fmt::v5::
             format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
             ::TYPES,args);
  testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
            ((internal *)&gtest_ar_2,"\"1~234~567\"",
             "fmt::vformat(loc, \"{:n}\", fmt::format_args(as))",(char (*) [10])"1~234~567",&s);
  std::__cxx11::string::~string((string *)&s);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&s);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/locale-test.cc"
               ,0x16,pcVar1);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&s);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&s);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  gtest_ar_2.success_ = true;
  gtest_ar_2._1_3_ = 0x12d6;
  fmt::v5::format_to<std::back_insert_iterator<std::__cxx11::string>,char[5],int>
            (&s,&loc,(char (*) [5])"{:n}",(int *)&gtest_ar_2);
  testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
            ((internal *)&gtest_ar_2,"\"1~234~567\"","s",(char (*) [10])"1~234~567",&s);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/locale-test.cc"
               ,0x19,pcVar1);
    testing::internal::AssertHelper::operator=(&local_18,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_18);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  std::__cxx11::string::~string((string *)&s);
  std::locale::~locale(&loc);
  return;
}

Assistant:

TEST(LocaleTest, Format) {
  std::locale loc(std::locale(), new numpunct<char>());
  EXPECT_EQ("1,234,567", fmt::format(std::locale(), "{:n}", 1234567));
  EXPECT_EQ("1~234~567", fmt::format(loc, "{:n}", 1234567));
  fmt::format_arg_store<fmt::format_context, int> as{1234567};
  EXPECT_EQ("1~234~567", fmt::vformat(loc, "{:n}", fmt::format_args(as)));
  std::string s;
  fmt::format_to(std::back_inserter(s), loc, "{:n}", 1234567);
  EXPECT_EQ("1~234~567", s);
}